

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTestCase.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_0::LocationValidator::validateSingleVariable
          (LocationValidator *this,
          vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
          *path,string *resource,GLint propValue,string *implementationName)

{
  ostringstream *poVar1;
  ostringstream *this_00;
  Storage SVar2;
  uint uVar3;
  undefined4 uVar4;
  pointer pVVar5;
  int *piVar6;
  InterfaceBlock *pIVar7;
  TestContext *pTVar8;
  int iVar9;
  int iVar10;
  undefined4 extraout_var;
  undefined8 *puVar11;
  long *plVar12;
  char *pcVar13;
  ulong uVar14;
  long *plVar15;
  int iVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  InterfaceBlock *block;
  long lVar20;
  bool bVar21;
  bool bVar22;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string elementResourceName;
  string arrayResourceName;
  string reasonStr;
  long *local_278;
  undefined8 local_270;
  long local_268;
  undefined8 uStack_260;
  ulong *local_258;
  long local_250;
  ulong local_248 [2];
  long *local_238;
  long local_230;
  long local_228;
  long lStack_220;
  ulong *local_218;
  long local_210;
  ulong local_208 [2];
  long *local_1f8;
  long local_1f0;
  long local_1e8 [2];
  char *local_1d8;
  long local_1d0;
  char local_1c8;
  undefined7 uStack_1c7;
  ulong local_1b8;
  undefined1 local_1b0 [16];
  TestLog local_1a0 [12];
  ios_base local_140 [8];
  ios_base local_138 [264];
  
  pVVar5 = (path->
           super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (pVVar5->m_type == TYPE_INTERFACEBLOCK) {
    bVar21 = ((pVVar5->m_data).block)->storage == STORAGE_UNIFORM;
    lVar17 = 0x14;
    lVar19 = 0x10;
  }
  else {
    lVar17 = 0x18;
    lVar19 = 0;
    bVar21 = false;
  }
  iVar10 = (((path->
             super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
             )._M_impl.super__Vector_impl_data._M_finish[-1].m_data.block)->layout).offset;
  uVar18 = (ulong)*(uint *)((long)&((pVVar5->m_data).type)->m_type + lVar17);
  piVar6 = *(int **)((long)&pVVar5->m_data + lVar19);
  if (pVVar5->m_type == TYPE_INTERFACEBLOCK) {
    pIVar7 = (pVVar5->m_data).block;
    SVar2 = pIVar7->storage;
    if (STORAGE_PATCH_OUT < SVar2) goto LAB_015c0a2e;
    if ((99U >> (SVar2 & 0x1f) & 1) == 0) {
      iVar16 = -1;
      if (SVar2 != STORAGE_UNIFORM) goto LAB_015c0a2e;
    }
    else {
      iVar16 = (pIVar7->layout).location;
      lVar17 = *(long *)&(pIVar7->variables).
                         super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                         ._M_impl;
      local_1b8 = uVar18;
      if (0 < (int)((ulong)((long)(pIVar7->variables).
                                  super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - lVar17) >> 5) *
              -0x55555555) {
        lVar19 = 0;
        lVar20 = 0;
        do {
          if (*(int *)(lVar17 + lVar19) != -1) {
            iVar16 = *(int *)(lVar17 + lVar19);
          }
          if ((VarType *)(lVar17 + lVar19) ==
              (path->
              super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
              )._M_impl.super__Vector_impl_data._M_start[1].m_data.type) break;
          if (iVar16 == -1) {
            iVar16 = -1;
          }
          else {
            iVar9 = getVariableLocationLength((VarType *)(lVar17 + lVar19 + 0x20));
            iVar16 = iVar16 + iVar9;
          }
          lVar20 = lVar20 + 1;
          lVar17 = *(long *)&(pIVar7->variables).
                             super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                             ._M_impl;
          lVar19 = lVar19 + 0x60;
        } while (lVar20 < (int)((ulong)((long)(pIVar7->variables).
                                              super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                                              ._M_impl.super__Vector_impl_data._M_finish - lVar17)
                               >> 5) * -0x55555555);
      }
      iVar16 = getIOSubVariableLocation(path,2,iVar16);
      uVar18 = local_1b8;
    }
  }
  else {
LAB_015c0a2e:
    uVar3 = piVar6[6];
    iVar16 = -1;
    if (uVar3 < 7) {
      if ((99U >> (uVar3 & 0x1f) & 1) == 0) {
        if (uVar3 == 3) {
          iVar16 = *piVar6;
        }
      }
      else {
        iVar16 = getIOSubVariableLocation(path,1,*piVar6);
      }
    }
  }
  bVar22 = iVar10 == 0x54;
  local_1d8 = &local_1c8;
  local_1d0 = 0;
  pcVar13 = "Uniform block variables have effective location of -1";
  if (bVar22) {
    pcVar13 = "Atomic counter uniforms have effective location of -1";
  }
  local_1c8 = '\0';
  if (bVar22 || bVar21) {
    std::__cxx11::string::_M_replace((ulong)&local_1d8,0,(char *)0x0,(ulong)pcVar13);
    local_1b0._0_8_ = ((this->super_SingleVariableValidator).super_PropValidator.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Verifying uniform location, expecting -1. (",0x2b);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,local_1d8,local_1d0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,")",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
    if (propValue == -1) goto LAB_015c103b;
    local_1b0._0_8_ = ((this->super_SingleVariableValidator).super_PropValidator.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\tError, got ",0xc);
    std::ostream::operator<<(poVar1,propValue);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
    local_1b0._0_8_ = local_1a0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b0,"resource location invalid","");
    pTVar8 = (this->super_SingleVariableValidator).super_PropValidator.m_testCtx;
    if (pTVar8->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(pTVar8,QP_TEST_RESULT_FAIL,(char *)local_1b0._0_8_);
    }
  }
  else {
    if ((uint)uVar18 < 7) {
      (*(code *)(&DAT_01cb6904 + *(int *)(&DAT_01cb6904 + uVar18 * 4)))();
      return;
    }
    if (iVar16 == -1) {
      local_1b0._0_8_ = ((this->super_SingleVariableValidator).super_PropValidator.m_testCtx)->m_log
      ;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Verifying location, expecting a valid location",0x2e);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_138);
      bVar21 = propValue != -1;
    }
    else {
      local_1b0._0_8_ = ((this->super_SingleVariableValidator).super_PropValidator.m_testCtx)->m_log
      ;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Verifying location, expecting ",0x1e);
      std::ostream::operator<<(poVar1,iVar16);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_138);
      bVar21 = iVar16 == propValue;
    }
    if (bVar21) {
      pVVar5 = (path->
               super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar14 = (long)(path->
                     super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pVVar5;
      if ((uVar14 < 0x11) || (*(int *)((long)pVVar5 + (uVar14 - 0x18)) != 0)) {
        bVar21 = false;
      }
      else {
        bVar21 = **(int **)((long)pVVar5 + (uVar14 - 0x20)) == 1;
      }
      iVar10 = (*((this->super_SingleVariableValidator).super_PropValidator.m_renderContext)->
                 _vptr_RenderContext[3])();
      uVar4 = 0;
      if ((uint)uVar18 < 7) {
        uVar4 = *(undefined4 *)(&DAT_01cb6fe0 + uVar18 * 4);
      }
      local_1b0._0_8_ = ((this->super_SingleVariableValidator).super_PropValidator.m_testCtx)->m_log
      ;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,
                 "Comparing location to the values returned by GetProgramResourceLocation",0x47);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_138);
      if (bVar21) {
        if (implementationName->_M_string_length < 4) {
          local_1f8 = local_1e8;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,0x1b3c1e9);
        }
        else {
          std::__cxx11::string::substr((ulong)&local_1f8,(ulong)implementationName);
        }
        if (0 < *(int *)(*(long *)((long)pVVar5 + (uVar14 - 0x20)) + 0x10)) {
          poVar1 = (ostringstream *)(local_1b0 + 8);
          this_00 = (ostringstream *)(local_1b0 + 8);
          iVar16 = 0;
          do {
            local_258 = local_248;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_258,local_1f8,local_1f0 + (long)local_1f8);
            std::__cxx11::string::append((char *)&local_258);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
            std::ostream::operator<<((ostringstream *)local_1b0,iVar16);
            std::__cxx11::stringbuf::str();
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
            std::ios_base::~ios_base(local_140);
            uVar18 = 0xf;
            if (local_258 != local_248) {
              uVar18 = local_248[0];
            }
            if (uVar18 < (ulong)(local_210 + local_250)) {
              uVar18 = 0xf;
              if (local_218 != local_208) {
                uVar18 = local_208[0];
              }
              if (uVar18 < (ulong)(local_210 + local_250)) goto LAB_015c118f;
              puVar11 = (undefined8 *)
                        std::__cxx11::string::replace
                                  ((ulong)&local_218,0,(char *)0x0,(ulong)local_258);
            }
            else {
LAB_015c118f:
              puVar11 = (undefined8 *)
                        std::__cxx11::string::_M_append((char *)&local_258,(ulong)local_218);
            }
            local_278 = &local_268;
            plVar12 = puVar11 + 2;
            if ((long *)*puVar11 == plVar12) {
              local_268 = *plVar12;
              uStack_260 = puVar11[3];
            }
            else {
              local_268 = *plVar12;
              local_278 = (long *)*puVar11;
            }
            local_270 = puVar11[1];
            *puVar11 = plVar12;
            puVar11[1] = 0;
            *(undefined1 *)plVar12 = 0;
            plVar12 = (long *)std::__cxx11::string::append((char *)&local_278);
            local_238 = &local_228;
            plVar15 = plVar12 + 2;
            if ((long *)*plVar12 == plVar15) {
              local_228 = *plVar15;
              lStack_220 = plVar12[3];
            }
            else {
              local_228 = *plVar15;
              local_238 = (long *)*plVar12;
            }
            local_230 = plVar12[1];
            *plVar12 = (long)plVar15;
            plVar12[1] = 0;
            *(undefined1 *)(plVar12 + 2) = 0;
            if (local_278 != &local_268) {
              operator_delete(local_278,local_268 + 1);
            }
            if (local_218 != local_208) {
              operator_delete(local_218,local_208[0] + 1);
            }
            if (local_258 != local_248) {
              operator_delete(local_258,local_248[0] + 1);
            }
            iVar9 = (**(code **)(CONCAT44(extraout_var,iVar10) + 0x9b0))
                              ((this->super_SingleVariableValidator).m_programID,uVar4,local_238);
            if (propValue + iVar16 == iVar9) {
              local_1b0._0_8_ =
                   ((this->super_SingleVariableValidator).super_PropValidator.m_testCtx)->m_log;
              std::__cxx11::ostringstream::ostringstream(this_00);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)this_00,"\tLocation of \"",0xe);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)this_00,(char *)local_238,local_230);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\":\t",3);
              std::ostream::operator<<(this_00,iVar9);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream(this_00);
              std::ios_base::~ios_base(local_138);
            }
            else {
              local_1b0._0_8_ =
                   ((this->super_SingleVariableValidator).super_PropValidator.m_testCtx)->m_log;
              std::__cxx11::ostringstream::ostringstream(poVar1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,"\tError, getProgramResourceLocation (resource=\"",0x2e);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,(char *)local_238,local_230);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,"\") returned location ",0x15);
              std::ostream::operator<<(poVar1,iVar9);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,", expected ",0xb);
              std::ostream::operator<<(poVar1,propValue + iVar16);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream(poVar1);
              std::ios_base::~ios_base(local_138);
              local_1b0._0_8_ = local_1a0;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_1b0,"resource location invalid","");
              pTVar8 = (this->super_SingleVariableValidator).super_PropValidator.m_testCtx;
              if (pTVar8->m_testResult == QP_TEST_RESULT_PASS) {
                tcu::TestContext::setTestResult(pTVar8,QP_TEST_RESULT_FAIL,(char *)local_1b0._0_8_);
              }
              if ((TestLog *)local_1b0._0_8_ != local_1a0) {
                operator_delete((void *)local_1b0._0_8_,
                                (ulong)((long)&(local_1a0[0].m_log)->flags + 1));
              }
            }
            if (local_238 != &local_228) {
              operator_delete(local_238,local_228 + 1);
            }
            iVar16 = iVar16 + 1;
          } while (iVar16 < *(int *)(*(long *)((long)pVVar5 + (uVar14 - 0x20)) + 0x10));
        }
        if (local_1f8 != local_1e8) {
          operator_delete(local_1f8,local_1e8[0] + 1);
        }
        goto LAB_015c103b;
      }
      iVar10 = (**(code **)(CONCAT44(extraout_var,iVar10) + 0x9b0))
                         ((this->super_SingleVariableValidator).m_programID,uVar4,
                          (implementationName->_M_dataplus)._M_p);
      if (iVar10 == propValue) goto LAB_015c103b;
      local_1b0._0_8_ = ((this->super_SingleVariableValidator).super_PropValidator.m_testCtx)->m_log
      ;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"\tError, getProgramResourceLocation returned location ",0x35);
      std::ostream::operator<<(poVar1,iVar10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", expected ",0xb);
      std::ostream::operator<<(poVar1,propValue);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_138);
      local_1b0._0_8_ = local_1a0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b0,"resource location invalid","");
      pTVar8 = (this->super_SingleVariableValidator).super_PropValidator.m_testCtx;
      if (pTVar8->m_testResult == QP_TEST_RESULT_PASS) {
        tcu::TestContext::setTestResult(pTVar8,QP_TEST_RESULT_FAIL,(char *)local_1b0._0_8_);
      }
    }
    else {
      local_1b0._0_8_ = ((this->super_SingleVariableValidator).super_PropValidator.m_testCtx)->m_log
      ;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\tError, got ",0xc);
      std::ostream::operator<<(poVar1,propValue);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_138);
      local_1b0._0_8_ = local_1a0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b0,"resource location invalid","");
      pTVar8 = (this->super_SingleVariableValidator).super_PropValidator.m_testCtx;
      if (pTVar8->m_testResult == QP_TEST_RESULT_PASS) {
        tcu::TestContext::setTestResult(pTVar8,QP_TEST_RESULT_FAIL,(char *)local_1b0._0_8_);
      }
    }
  }
  if ((TestLog *)local_1b0._0_8_ != local_1a0) {
    operator_delete((void *)local_1b0._0_8_,(ulong)((long)&(local_1a0[0].m_log)->flags + 1));
  }
LAB_015c103b:
  if (local_1d8 != &local_1c8) {
    operator_delete(local_1d8,CONCAT71(uStack_1c7,local_1c8) + 1);
  }
  return;
}

Assistant:

void LocationValidator::validateSingleVariable (const std::vector<VariablePathComponent>& path, const std::string& resource, glw::GLint propValue, const std::string& implementationName) const
{
	const bool			isAtomicCounterUniform	= glu::isDataTypeAtomicCounter(path.back().getVariableType()->getBasicType());
	const bool			isUniformBlockVariable	= path.front().isInterfaceBlock() && path.front().getInterfaceBlock()->storage == glu::STORAGE_UNIFORM;
	const bool			isVertexShader			= m_filter.getShaderTypeBits() == (1u << glu::SHADERTYPE_VERTEX);
	const bool			isFragmentShader		= m_filter.getShaderTypeBits() == (1u << glu::SHADERTYPE_FRAGMENT);
	const glu::Storage	storage					= (path.front().isInterfaceBlock()) ? (path.front().getInterfaceBlock()->storage) : (path.front().getDeclaration()->storage);
	const bool			isInputVariable			= (storage == glu::STORAGE_IN || storage == glu::STORAGE_PATCH_IN);
	const bool			isOutputVariable		= (storage == glu::STORAGE_OUT || storage == glu::STORAGE_PATCH_OUT);
	const int			explicitLayoutLocation	= getExplicitLocationFromPath(path);

	bool				expectLocation;
	std::string			reasonStr;

	DE_UNREF(resource);

	if (isAtomicCounterUniform)
	{
		expectLocation = false;
		reasonStr = "Atomic counter uniforms have effective location of -1";
	}
	else if (isUniformBlockVariable)
	{
		expectLocation = false;
		reasonStr = "Uniform block variables have effective location of -1";
	}
	else if (isInputVariable && !isVertexShader && explicitLayoutLocation == -1)
	{
		expectLocation = false;
		reasonStr = "Inputs (except for vertex shader inputs) not declared with a location layout qualifier have effective location of -1";
	}
	else if (isOutputVariable && !isFragmentShader && explicitLayoutLocation == -1)
	{
		expectLocation = false;
		reasonStr = "Outputs (except for fragment shader outputs) not declared with a location layout qualifier have effective location of -1";
	}
	else
	{
		expectLocation = true;
	}

	if (!expectLocation)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying uniform location, expecting -1. (" << reasonStr << ")" << tcu::TestLog::EndMessage;

		if (propValue != -1)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "\tError, got " << propValue << tcu::TestLog::EndMessage;
			setError("resource location invalid");
		}
	}
	else
	{
		bool locationOk;

		if (explicitLayoutLocation == -1)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Verifying location, expecting a valid location" << tcu::TestLog::EndMessage;
			locationOk = (propValue != -1);
		}
		else
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Verifying location, expecting " << explicitLayoutLocation << tcu::TestLog::EndMessage;
			locationOk = (propValue == explicitLayoutLocation);
		}

		if (!locationOk)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "\tError, got " << propValue << tcu::TestLog::EndMessage;
			setError("resource location invalid");
		}
		else
		{
			const VariablePathComponent		nullComponent;
			const VariablePathComponent&	enclosingcomponent	= (path.size() > 1) ? (path[path.size()-2]) : (nullComponent);
			const bool						isArray				= enclosingcomponent.isVariableType() && enclosingcomponent.getVariableType()->isArrayType();

			const glw::Functions&			gl					= m_renderContext.getFunctions();
			const glw::GLenum				interface			= getProgramDefaultBlockInterfaceFromStorage(storage);

			m_testCtx.getLog() << tcu::TestLog::Message << "Comparing location to the values returned by GetProgramResourceLocation" << tcu::TestLog::EndMessage;

			// Test all bottom-level array elements
			if (isArray)
			{
				const std::string arrayResourceName = (implementationName.size() > 3) ? (implementationName.substr(0, implementationName.size() - 3)) : (""); // chop "[0]"

				for (int arrayElementNdx = 0; arrayElementNdx < enclosingcomponent.getVariableType()->getArraySize(); ++arrayElementNdx)
				{
					const std::string	elementResourceName	= arrayResourceName + "[" + de::toString(arrayElementNdx) + "]";
					const glw::GLint	location			= gl.getProgramResourceLocation(m_programID, interface, elementResourceName.c_str());

					if (location != propValue+arrayElementNdx)
					{
						m_testCtx.getLog()
							<< tcu::TestLog::Message
							<< "\tError, getProgramResourceLocation (resource=\"" << elementResourceName << "\") returned location " << location
							<< ", expected " << (propValue+arrayElementNdx)
							<< tcu::TestLog::EndMessage;
						setError("resource location invalid");
					}
					else
						m_testCtx.getLog() << tcu::TestLog::Message << "\tLocation of \"" << elementResourceName << "\":\t" << location << tcu::TestLog::EndMessage;
				}
			}
			else
			{
				const glw::GLint location = gl.getProgramResourceLocation(m_programID, interface, implementationName.c_str());

				if (location != propValue)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "\tError, getProgramResourceLocation returned location " << location << ", expected " << propValue << tcu::TestLog::EndMessage;
					setError("resource location invalid");
				}
			}

		}
	}
}